

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_1::SymbolTable::EnsureUnique(SymbolTable *this,string_view *name)

{
  FILE *__stream;
  size_type sVar1;
  const_reference pcVar2;
  string_view *name_local;
  SymbolTable *this_local;
  
  sVar1 = std::
          set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>::
          count(&this->seen_names_,name);
  __stream = _stderr;
  if (sVar1 == 0) {
    std::set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>::
    insert(&this->seen_names_,name);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    pcVar2 = string_view::operator[](name,0);
    fprintf(__stream,"error: duplicate symbol when writing relocatable binary: %s\n",pcVar2);
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result EnsureUnique(const string_view& name) {
    if (seen_names_.count(name)) {
      fprintf(stderr, "error: duplicate symbol when writing relocatable "
              "binary: %s\n", &name[0]);
      return Result::Error;
    }
    seen_names_.insert(name);
    return Result::Ok;
  }